

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O2

void __thiscall
glcts::DrawBuffersIndexedColorMasks::prepareFramebuffer(DrawBuffersIndexedColorMasks *this)

{
  int iVar1;
  undefined4 extraout_var;
  ResourceError *this_00;
  int i;
  long lVar3;
  allocator_type local_45;
  GLint maxDrawBuffers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufs;
  long lVar2;
  
  iVar1 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  maxDrawBuffers = 0;
  (**(code **)(lVar2 + 0x868))(0x8824,&maxDrawBuffers);
  if (3 < maxDrawBuffers) {
    (**(code **)(lVar2 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar2 + 0x78))(0x8d40,this->m_fbo);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&bufs,(long)maxDrawBuffers,&local_45);
    for (lVar3 = 0; lVar3 < maxDrawBuffers; lVar3 = lVar3 + 1) {
      bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3] = (int)lVar3 + 0x8ce0;
    }
    (**(code **)(lVar2 + 0x560))
              ((long)maxDrawBuffers,
               bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    (**(code **)(lVar2 + 0x4e8))(0xbd0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufs,"Minimum number of draw buffers too low",(allocator<char> *)&local_45);
  tcu::ResourceError::ResourceError(this_00,(string *)&bufs);
  __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawBuffersIndexedColorMasks::prepareFramebuffer()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		throw tcu::ResourceError("Minimum number of draw buffers too low");
	}

	gl.genFramebuffers(1, &m_fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);

	std::vector<glw::GLenum> bufs(maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		bufs[i] = GL_COLOR_ATTACHMENT0 + i;
	}
	gl.drawBuffers(maxDrawBuffers, &bufs[0]);

	gl.disable(GL_DITHER);
}